

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

null_terminating_iterator<char> __thiscall
fmt::v5::internal::
parse_arg_id<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&,char>>
          (internal *this,null_terminating_iterator<char> it,
          precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
          *handler)

{
  basic_format_specs<char> *pbVar1;
  internal iVar2;
  uint arg_id;
  internal *piVar3;
  precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
  *this_00;
  internal *piVar4;
  basic_string_view<char> id;
  null_terminating_iterator<char> nVar5;
  undefined1 local_49;
  null_terminating_iterator<char> local_48;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  local_38;
  
  this_00 = (precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
             *)it.end_;
  piVar4 = (internal *)it.ptr_;
  local_48.end_ = (char *)piVar4;
  local_48.ptr_ = (char *)this;
  if (this == piVar4) {
    iVar2 = (internal)0x0;
  }
  else {
    iVar2 = *this;
    if ((iVar2 == (internal)0x7d) || (iVar2 == (internal)0x3a)) {
      precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
      ::operator()(this_00);
      local_48.end_ = (char *)piVar4;
      goto LAB_00121bfa;
    }
    if ((byte)((char)iVar2 - 0x30U) < 10) {
      arg_id = parse_nonnegative_int<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&,char>&>
                         (&local_48,this_00);
      if ((local_48.ptr_ == local_48.end_) ||
         (((internal)*local_48.ptr_ != (internal)0x3a &&
          ((internal)*local_48.ptr_ != (internal)0x7d)))) {
        basic_parse_context<char,_fmt::v5::internal::error_handler>::on_error
                  ((basic_parse_context<char,_fmt::v5::internal::error_handler> *)
                   (this_00->handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                   ).context_,"invalid format string");
      }
      else {
        pbVar1 = (this_00->handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                 ).super_specs_setter<char>.specs_;
        specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        ::get_arg<unsigned_int>
                  (&local_38,
                   &this_00->handler->
                    super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                   ,arg_id);
        set_dynamic_spec<fmt::v5::internal::precision_checker,int,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,fmt::v5::internal::error_handler>
                  (&pbVar1->precision_,&local_49);
      }
      goto LAB_00121bfa;
    }
  }
  if ((iVar2 == (internal)0x5f) || ((byte)(((byte)iVar2 & 0xdf) + 0xbf) < 0x1a)) {
    id.size_ = 0;
    piVar3 = this + 1;
    do {
      local_48.ptr_ = (char *)piVar3;
      if ((internal *)local_48.ptr_ == piVar4) {
        iVar2 = (internal)0x0;
      }
      else {
        iVar2 = (internal)*local_48.ptr_;
      }
      piVar3 = (internal *)local_48.ptr_ + 1;
      id.size_ = id.size_ + 1;
    } while ((((byte)((char)iVar2 - 0x30U) < 10) || (iVar2 == (internal)0x5f)) ||
            ((byte)(((byte)iVar2 & 0xdf) + 0xbf) < 0x1a));
    if ((long)id.size_ < 0) {
      __assert_fail("(value >= 0) && \"negative value\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/3rdparty/fmt/include/fmt/core.h"
                    ,0xd3,
                    "typename std::make_unsigned<Int>::type fmt::internal::to_unsigned(Int) [Int = long]"
                   );
    }
    id.data_ = (char *)this;
    precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
    ::operator()(this_00,id);
    local_48.end_ = (char *)piVar4;
  }
  else {
    basic_parse_context<char,_fmt::v5::internal::error_handler>::on_error
              ((basic_parse_context<char,_fmt::v5::internal::error_handler> *)
               (this_00->handler->
               super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
               ).context_,"invalid format string");
    local_48.end_ = (char *)piVar4;
  }
LAB_00121bfa:
  nVar5.end_ = local_48.end_;
  nVar5.ptr_ = local_48.ptr_;
  return nVar5;
}

Assistant:

FMT_CONSTEXPR Iterator parse_arg_id(Iterator it, IDHandler &&handler) {
  typedef typename std::iterator_traits<Iterator>::value_type char_type;
  char_type c = *it;
  if (c == '}' || c == ':') {
    handler();
    return it;
  }
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(it, handler);
    if (*it != '}' && *it != ':') {
      handler.on_error("invalid format string");
      return it;
    }
    handler(index);
    return it;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return it;
  }
  auto start = it;
  do {
    c = *++it;
  } while (is_name_start(c) || ('0' <= c && c <= '9'));
  handler(basic_string_view<char_type>(pointer_from(start), to_unsigned(it - start)));
  return it;
}